

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxOutputComponentsSinglePointTest::
~GeometryShaderMaxOutputComponentsSinglePointTest
          (GeometryShaderMaxOutputComponentsSinglePointTest *this)

{
  ~GeometryShaderMaxOutputComponentsSinglePointTest(this);
  operator_delete(this,0x370);
  return;
}

Assistant:

virtual ~GeometryShaderMaxOutputComponentsSinglePointTest()
	{
	}